

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int anon_unknown.dwarf_32f05::HandleCppCheck
              (string *runCmd,string *sourceFile,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *orig_cmd)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  int iVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *opt;
  pointer __x;
  string_view arg;
  int ret;
  string stdErr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cppcheck_cmd;
  string stdOut;
  
  iVar6 = 1;
  arg._M_str = (runCmd->_M_dataplus)._M_p;
  arg._M_len = runCmd->_M_string_length;
  cmExpandedList_abi_cxx11_(&cppcheck_cmd,arg,true);
  pbVar1 = (orig_cmd->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (orig_cmd->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pbVar1; __x = __x + 1) {
    if ((((2 < __x->_M_string_length) && (pcVar7 = (__x->_M_dataplus)._M_p, *pcVar7 == '-')) &&
        (uVar3 = (byte)pcVar7[1] - 0x44, uVar3 < 0x12)) && ((0x20021U >> (uVar3 & 0x1f) & 1) != 0))
    {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&cppcheck_cmd,__x);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&cppcheck_cmd,sourceFile);
  stdOut._M_dataplus._M_p = (pointer)&stdOut.field_2;
  stdOut._M_string_length = 0;
  stdOut.field_2._M_local_buf[0] = '\0';
  stdErr._M_dataplus._M_p = (pointer)&stdErr.field_2;
  stdErr._M_string_length = 0;
  stdErr.field_2._M_local_buf[0] = '\0';
  bVar2 = cmSystemTools::RunSingleCommand
                    (&cppcheck_cmd,&stdOut,&stdErr,&ret,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0,Auto
                    );
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error running \'");
    poVar5 = std::operator<<(poVar5,(string *)
                                    cppcheck_cmd.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar5 = std::operator<<(poVar5,"\': ");
    poVar5 = std::operator<<(poVar5,(string *)&stdOut);
    std::operator<<(poVar5,"\n");
    goto LAB_00158003;
  }
  std::operator<<((ostream *)&std::cerr,(string *)&stdOut);
  lVar4 = std::__cxx11::string::find((char *)&stdErr,0x583284);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)&stdErr,0x58328c);
    if (lVar4 != -1) goto LAB_00157f7e;
    lVar4 = std::__cxx11::string::find((char *)&stdErr,0x583296);
    if (lVar4 != -1) goto LAB_00157f7e;
    lVar4 = std::__cxx11::string::find((char *)&stdErr,0x58329e);
    if (lVar4 != -1) goto LAB_00157f7e;
    lVar4 = std::__cxx11::string::find((char *)&stdErr,0x5832ac);
    if (lVar4 != -1) goto LAB_00157f7e;
    lVar4 = std::__cxx11::string::find((char *)&stdErr,0x5832ba);
    if (lVar4 != -1) goto LAB_00157f7e;
  }
  else {
LAB_00157f7e:
    pcVar7 = "Error: cppcheck reported failure:\n";
    if (ret == 0) {
      pcVar7 = "Warning: cppcheck reported diagnostics:\n";
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
  }
  std::operator<<((ostream *)&std::cerr,(string *)&stdErr);
  iVar6 = ret;
LAB_00158003:
  std::__cxx11::string::~string((string *)&stdErr);
  std::__cxx11::string::~string((string *)&stdOut);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cppcheck_cmd);
  return iVar6;
}

Assistant:

int HandleCppCheck(const std::string& runCmd, const std::string& sourceFile,
                   const std::vector<std::string>& orig_cmd)
{
  // Construct the cpplint command line.
  std::vector<std::string> cppcheck_cmd = cmExpandedList(runCmd, true);
  // extract all the -D, -U, and -I options from the compile line
  for (auto const& opt : orig_cmd) {
    if (opt.size() > 2) {
      if ((opt[0] == '-') &&
          ((opt[1] == 'D') || (opt[1] == 'I') || (opt[1] == 'U'))) {
        cppcheck_cmd.push_back(opt);
// convert cl / options to - options if needed
#if defined(_WIN32)
      } else if ((opt[0] == '/') &&
                 ((opt[1] == 'D') || (opt[1] == 'I') || (opt[1] == 'U'))) {
        std::string optcopy = opt;
        optcopy[0] = '-';
        cppcheck_cmd.push_back(optcopy);
#endif
      }
    }
  }
  // add the source file
  cppcheck_cmd.push_back(sourceFile);

  // Run the cpplint command line.  Capture its output.
  std::string stdOut;
  std::string stdErr;
  int ret;
  if (!cmSystemTools::RunSingleCommand(cppcheck_cmd, &stdOut, &stdErr, &ret,
                                       nullptr, cmSystemTools::OUTPUT_NONE)) {
    std::cerr << "Error running '" << cppcheck_cmd[0] << "': " << stdOut
              << "\n";
    return 1;
  }
  std::cerr << stdOut;
  // Output the output from cpplint to stderr
  if (stdErr.find("(error)") != std::string::npos ||
      stdErr.find("(warning)") != std::string::npos ||
      stdErr.find("(style)") != std::string::npos ||
      stdErr.find("(performance)") != std::string::npos ||
      stdErr.find("(portability)") != std::string::npos ||
      stdErr.find("(information)") != std::string::npos) {
    if (ret == 0) {
      std::cerr << "Warning: cppcheck reported diagnostics:\n";
    } else {
      std::cerr << "Error: cppcheck reported failure:\n";
    }
  }
  std::cerr << stdErr;

  return ret;
}